

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::absolute_pose::modules::p3p_kneip_main
               (bearingVectors_t *f,points_t *p,transformations_t *solutions)

{
  LhsNested pMVar1;
  undefined1 auVar2 [16];
  pointer pMVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double *pdVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  int i;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  transformation_t solution;
  bearingVector_t f2;
  bearingVector_t f1;
  bearingVector_t f3;
  point_t P3;
  Vector3d e1;
  point_t P1;
  rotation_t N;
  rotation_t R;
  translation_t C;
  vector<double,_std::allocator<double>_> realRoots;
  Vector3d temp1;
  point_t P2;
  rotation_t T;
  Vector3d n3;
  Vector3d n1;
  Vector3d temp2;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  ulong uStack_438;
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  scalar_constant_op<double> local_3f0;
  variable_if_dynamic<long,__1> local_3e8;
  variable_if_dynamic<long,__1> vStack_3e0;
  Index local_3d8;
  double local_3b8 [3];
  Matrix<double,_3,_1,_0,_3,_1> local_3a0;
  Matrix<double,_3,_1,_0,_3,_1> local_380;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [32];
  undefined1 local_310 [56];
  double dStack_2d8;
  double local_2d0;
  undefined1 local_2c0 [40];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *local_298;
  double local_290;
  double dStack_288;
  double local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [80];
  Matrix<double,_3,_3,_0,_3,_3> local_218;
  undefined1 local_1d0 [16];
  double local_1c0;
  Matrix<double,_3,_1,_0,_3,_1> local_1b0;
  _Vector_base<double,_std::allocator<double>_> local_198;
  undefined1 local_180 [16];
  double local_170;
  double dStack_168;
  double dStack_160;
  undefined1 local_150 [32];
  undefined1 local_130 [64];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined1 local_d0 [32];
  double local_b0;
  double dStack_a8;
  double local_a0;
  double local_98;
  double local_90;
  double dStack_88;
  double local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pMVar3 = (p->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_400._0_8_ = local_150;
  local_2c0._16_8_ =
       *(double *)
        ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data + 0x10);
  local_2c0._0_8_ =
       (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [0];
  local_2c0._8_8_ =
       *(double *)
        ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data + 8);
  local_150._16_8_ =
       *(double *)
        ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  local_150._0_8_ =
       pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_150._8_8_ =
       *(double *)
        ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 8);
  local_310._16_8_ =
       *(double *)
        ((long)&pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  local_310._0_8_ =
       pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_310._8_8_ =
       *(double *)
        ((long)&pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 8);
  local_400._8_8_ = (non_const_type)local_2c0;
  local_310._40_8_ = solutions;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_170,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_400);
  local_400._0_8_ = (LhsNested)local_310;
  local_400._8_8_ = (non_const_type)local_2c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_98,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_400);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_170;
  auVar28._8_8_ = dStack_160;
  auVar28._0_8_ = dStack_160;
  auVar23._8_8_ = dStack_88;
  auVar23._0_8_ = local_90;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_98;
  auVar30._8_8_ = dStack_88;
  auVar30._0_8_ = dStack_88;
  auVar24._8_8_ = dStack_160;
  auVar24._0_8_ = dStack_168;
  auVar27 = vunpcklpd_avx(auVar28,auVar26);
  auVar22 = vunpcklpd_avx(auVar30,auVar22);
  auVar29._0_8_ = local_90 * auVar27._0_8_;
  auVar29._8_8_ = dStack_88 * auVar27._8_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_98 * dStack_168;
  auVar23 = vfmsub231sd_fma(auVar27,auVar26,auVar23);
  auVar27 = vfmsub213pd_fma(auVar22,auVar24,auVar29);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       auVar23._0_8_ * auVar23._0_8_ + auVar27._0_8_ * auVar27._0_8_ + auVar27._8_8_ * auVar27._8_8_
  ;
  auVar27 = vsqrtsd_avx(auVar25,auVar25);
  if ((auVar27._0_8_ != 0.0) || (NAN(auVar27._0_8_))) {
    pMVar3 = (f->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data + 0x10);
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
    pdVar9 = (double *)
             ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data + 8);
    local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = *pdVar9;
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
    auVar71._8_8_ =
         local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    auVar71._0_8_ =
         local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
    pdVar10 = (double *)
              ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data + 8);
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = *pdVar10;
    local_330._16_8_ =
         *(double *)
          ((long)&pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data + 0x10);
    auVar82._8_8_ =
         local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    auVar82._0_8_ =
         local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    local_330._0_8_ =
         pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    local_330._8_8_ =
         *(double *)
          ((long)&pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data + 8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    auVar27 = vunpcklpd_avx(auVar82,auVar33);
    auVar22 = vunpcklpd_avx(auVar71,auVar38);
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar23 = vfmsub231sd_fma(auVar34,auVar38,*(undefined1 (*) [16])pdVar10);
    auVar72._0_8_ =
         local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] * auVar22._0_8_;
    auVar72._8_8_ =
         local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] * auVar22._8_8_;
    auVar27 = vfmsub213pd_fma(auVar27,*(undefined1 (*) [16])pdVar9,auVar72);
    local_420._0_8_ = auVar27._0_8_;
    local_420._8_8_ = auVar27._8_8_;
    local_420._16_8_ = auVar23._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         (double)local_420._16_8_ * (double)local_420._16_8_ +
         (double)local_420._0_8_ * (double)local_420._0_8_ +
         (double)local_420._8_8_ * (double)local_420._8_8_;
    auVar27 = vsqrtsd_avx(auVar35,auVar35);
    local_3f0.m_other = auVar27._0_8_;
    local_400._0_8_ = (LhsNested)local_420;
    local_310._48_8_ =
         local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    dStack_2d8 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
    local_2d0 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_420,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_400);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_420._0_8_;
    auVar73._8_8_ = local_420._16_8_;
    auVar73._0_8_ = local_420._16_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_310._48_8_;
    auVar83._8_8_ = local_2d0;
    auVar83._0_8_ = local_2d0;
    auVar31._8_8_ = local_420._16_8_;
    auVar31._0_8_ = local_420._8_8_;
    auVar32._8_8_ = local_2d0;
    auVar32._0_8_ = dStack_2d8;
    local_400._0_8_ = local_150 + 0x18;
    auVar27 = vunpcklpd_avx(auVar73,auVar39);
    auVar22 = vunpcklpd_avx(auVar83,auVar36);
    auVar74._0_8_ = dStack_2d8 * auVar27._0_8_;
    auVar74._8_8_ = local_2d0 * auVar27._8_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (double)local_310._48_8_ * (double)local_420._8_8_;
    auVar27 = vfmsub231sd_fma(auVar37,auVar39,auVar32);
    local_1d0 = vfmsub213pd_fma(auVar22,auVar31,auVar74);
    local_1c0 = auVar27._0_8_;
    local_3e8.m_value = 0;
    vStack_3e0.m_value = 0;
    local_3d8 = 1;
    local_3f0.m_other = (double)local_400._0_8_;
    local_278._0_8_ = (non_const_type)(local_310 + 0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278);
    local_400._0_8_ = local_130;
    pMVar1 = (LhsNested)(local_150 + 0x18);
    local_3e8.m_value = 1;
    vStack_3e0.m_value = 0;
    local_3d8 = 1;
    local_3f0.m_other = (double)pMVar1;
    local_278._0_8_ = (non_const_type)local_1d0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278);
    local_400._0_8_ = local_130 + 8;
    local_3e8.m_value = 2;
    vStack_3e0.m_value = 0;
    local_3d8 = 1;
    local_3f0.m_other = (double)pMVar1;
    local_278._0_8_ = (LhsNested)local_420;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278);
    local_400._0_8_ = pMVar1;
    local_400._8_8_ = (non_const_type)local_330;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_330,
               (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)local_400);
    if (0.0 < (double)local_330._16_8_) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&local_380,
                 (f->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&local_3a0,
                 (f->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_330,
                 (f->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)(local_310 + 0x30),&local_380);
      auVar63._8_8_ = 0;
      auVar63._0_8_ =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar75._8_8_ =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar75._0_8_ =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar14._8_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar14._0_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      auVar41._8_8_ = 0;
      auVar41._0_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar84._8_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar84._0_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar15._8_8_ =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar15._0_8_ =
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      local_400._0_8_ = local_420;
      auVar27 = vunpcklpd_avx(auVar75,auVar63);
      auVar22 = vunpcklpd_avx(auVar84,auVar41);
      auVar76._0_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * auVar27._0_8_;
      auVar76._8_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * auVar27._8_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] *
           local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      auVar23 = vfmsub231sd_fma(auVar42,auVar63,auVar14);
      auVar27 = vfmsub213pd_fma(auVar22,auVar15,auVar76);
      local_420._0_8_ = auVar27._0_8_;
      local_420._8_8_ = auVar27._8_8_;
      local_420._16_8_ = auVar23._0_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ =
           (double)local_420._16_8_ * (double)local_420._16_8_ +
           (double)local_420._0_8_ * (double)local_420._0_8_ +
           (double)local_420._8_8_ * (double)local_420._8_8_;
      auVar27 = vsqrtsd_avx(auVar43,auVar43);
      local_3f0.m_other = auVar27._0_8_;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_400._0_8_,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_400);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_420._0_8_;
      auVar77._8_8_ = local_420._16_8_;
      auVar77._0_8_ = local_420._16_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_310._48_8_;
      auVar85._8_8_ = local_2d0;
      auVar85._0_8_ = local_2d0;
      auVar13._8_8_ = local_420._16_8_;
      auVar13._0_8_ = local_420._8_8_;
      auVar16._8_8_ = local_2d0;
      auVar16._0_8_ = dStack_2d8;
      pMVar1 = (LhsNested)(local_150 + 0x18);
      auVar27 = vunpcklpd_avx(auVar77,auVar64);
      auVar22 = vunpcklpd_avx(auVar85,auVar44);
      auVar78._0_8_ = dStack_2d8 * auVar27._0_8_;
      auVar78._8_8_ = local_2d0 * auVar27._8_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = (double)local_310._48_8_ * (double)local_420._8_8_;
      auVar27 = vfmsub231sd_fma(auVar45,auVar64,auVar16);
      local_1d0 = vfmsub213pd_fma(auVar22,auVar13,auVar78);
      local_1c0 = auVar27._0_8_;
      local_3e8.m_value = 0;
      vStack_3e0.m_value = 0;
      local_3d8 = 1;
      local_400._0_8_ = pMVar1;
      local_3f0.m_other = (double)pMVar1;
      local_278._0_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)(local_310 + 0x30);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
                 (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278);
      local_400._0_8_ = local_130;
      local_278._0_8_ = local_1d0;
      local_3e8.m_value = 1;
      vStack_3e0.m_value = 0;
      local_3d8 = 1;
      local_3f0.m_other = (double)pMVar1;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
                 (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278);
      local_400._0_8_ = local_130 + 8;
      local_278._0_8_ = local_420;
      local_3e8.m_value = 2;
      vStack_3e0.m_value = 0;
      local_3d8 = 1;
      local_3f0.m_other = (double)pMVar1;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
                 (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278);
      local_400._8_8_ = local_330;
      local_400._0_8_ = pMVar1;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_400._8_8_,
                 (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                  *)local_400);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_2c0,
                 (p->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_150,
                 (p->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_310,
                 (p->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2);
    }
    local_400._0_8_ = local_150;
    local_400._8_8_ = (non_const_type)local_2c0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_b0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_400);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_a0 * local_a0 + local_b0 * local_b0 + dStack_a8 * dStack_a8;
    auVar27 = vsqrtsd_avx(auVar46,auVar46);
    local_3f0.m_other = auVar27._0_8_;
    local_400._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_b0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&local_b0,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_400);
    local_400._0_8_ = local_310;
    local_400._8_8_ = (non_const_type)local_2c0;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
    cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((type *)local_d0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_b0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_400);
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         (double)local_d0._16_8_ * (double)local_d0._16_8_ +
         (double)local_d0._0_8_ * (double)local_d0._0_8_ +
         (double)local_d0._8_8_ * (double)local_d0._8_8_;
    auVar27 = vsqrtsd_avx(auVar47,auVar47);
    local_3f0.m_other = auVar27._0_8_;
    local_400._0_8_ = (LhsNested)local_d0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_d0,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_400);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_d0._0_8_;
    auVar79._8_8_ = local_d0._16_8_;
    auVar79._0_8_ = local_d0._16_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_b0;
    auVar86._8_8_ = local_a0;
    auVar86._0_8_ = local_a0;
    auVar17._8_8_ = local_d0._16_8_;
    auVar17._0_8_ = local_d0._8_8_;
    auVar18._8_8_ = local_a0;
    auVar18._0_8_ = dStack_a8;
    local_400._0_8_ = local_278;
    auVar27 = vunpcklpd_avx(auVar79,auVar65);
    auVar22 = vunpcklpd_avx(auVar86,auVar48);
    auVar80._0_8_ = dStack_a8 * auVar27._0_8_;
    auVar80._8_8_ = local_a0 * auVar27._8_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_b0 * (double)local_d0._8_8_;
    auVar27 = vfmsub231sd_fma(auVar49,auVar65,auVar18);
    local_f0 = vfmsub213pd_fma(auVar22,auVar17,auVar80);
    local_e0 = auVar27._0_8_;
    local_3e8.m_value = 0;
    vStack_3e0.m_value = 0;
    local_3d8 = 1;
    local_3f0.m_other = (double)local_400._0_8_;
    local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&local_b0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_218);
    local_400._0_8_ = local_278 + 8;
    local_3e8.m_value = 1;
    vStack_3e0.m_value = 0;
    local_3d8 = 1;
    local_3f0.m_other = (double)local_278;
    local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_f0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_218);
    local_400._0_8_ = local_268;
    local_3e8.m_value = 2;
    vStack_3e0.m_value = 0;
    local_3d8 = 1;
    local_3f0.m_other = (double)local_278;
    local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_d0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)local_400,
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_218);
    local_400._8_8_ = local_310;
    local_3f0.m_other = (double)local_2c0;
    local_400._0_8_ = (LhsNested)local_278;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_400._8_8_,
               (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
                *)local_400);
    uVar20 = local_310._8_8_;
    uVar19 = local_310._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dStack_160 * dStack_160 + local_170 * local_170 + dStack_168 * dStack_168;
    local_340 = vsqrtpd_avx(auVar50);
    dVar61 = (double)local_330._0_8_ / (double)local_330._16_8_;
    dVar40 = (double)local_330._8_8_ / (double)local_330._16_8_;
    auVar57._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_380,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3a0);
    auVar57._8_56_ = extraout_var;
    auVar51 = auVar57._0_16_;
    dVar62 = 1.0 / (1.0 - auVar57._0_8_ * auVar57._0_8_) + -1.0;
    if (dVar62 < 0.0) {
      auVar58._0_8_ = sqrt(dVar62);
      auVar58._8_56_ = extraout_var_00;
      auVar27 = auVar58._0_16_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auVar57._0_8_;
    }
    else {
      auVar52._8_8_ = 0;
      auVar52._0_8_ = dVar62;
      auVar27 = vsqrtsd_avx(auVar52,auVar52);
    }
    uVar4 = vcmpsd_avx512f(auVar51,ZEXT816(0) << 0x40,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar22 = vxorpd_avx512vl(auVar27,auVar6);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar61;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = dVar40;
    auVar23 = vmulsd_avx512f(auVar101,auVar101);
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar20;
    auVar24 = vmulsd_avx512f(auVar99,auVar99);
    local_360._0_8_ = (double)((ulong)bVar5 * auVar22._0_8_ + (ulong)!bVar5 * auVar27._0_8_);
    local_360._8_8_ = auVar27._8_8_;
    auVar25 = vmulsd_avx512f(local_340,local_340);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar19;
    auVar26 = vmulsd_avx512f(auVar103,auVar103);
    auVar27 = vaddsd_avx512f(auVar11,auVar11);
    auVar28 = vmulsd_avx512f(auVar11,auVar11);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar19;
    auVar29 = vaddsd_avx512f(auVar104,auVar104);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar20;
    auVar22 = vmulsd_avx512f(auVar100,auVar24);
    auVar30 = vaddsd_avx512f(auVar23,auVar23);
    auVar31 = vmulsd_avx512f(auVar23,auVar24);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = dVar40;
    auVar27 = vmulsd_avx512f(auVar27,auVar102);
    auVar32 = vmulsd_avx512f(auVar29,auVar24);
    auVar33 = vmulsd_avx512f(auVar104,auVar26);
    auVar34 = vmulsd_avx512f(auVar30,auVar22);
    dVar62 = auVar22._0_8_;
    auVar35 = vmulsd_avx512f(auVar100,auVar22);
    auVar27 = vmulsd_avx512f(auVar104,auVar27);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar19;
    auVar36 = vmulsd_avx512f(auVar105,auVar33);
    auVar34 = vmulsd_avx512f(local_340,auVar34);
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar62 + dVar62;
    auVar37 = vmulsd_avx512f(local_340,auVar94);
    auVar27 = vmulsd_avx512f(auVar27,auVar24);
    auVar22 = vmulsd_avx512f(auVar28,auVar35);
    auVar38 = vmulsd_avx512f(local_340,auVar27);
    auVar22 = vfnmsub231sd_fma(auVar22,auVar23,auVar35);
    auVar95._8_8_ = 0;
    auVar95._0_8_ = auVar34._0_8_ * local_360._0_8_;
    auVar27 = vfmadd231sd_fma(auVar95,local_360,auVar37);
    auVar37 = vaddsd_avx512f(auVar102,auVar102);
    local_80 = auVar22._0_8_ - auVar35._0_8_;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = auVar37._0_8_ * dVar62;
    auVar22 = vmulsd_avx512f(auVar11,auVar89);
    auVar37 = vmulsd_avx512f(auVar31,auVar25);
    auVar27 = vfnmadd231sd_avx512f(auVar27,auVar22,local_340);
    auVar22 = vmulsd_avx512f(local_340,auVar22);
    auVar96._8_8_ = 0;
    auVar96._0_8_ = auVar37._0_8_ * local_360._0_8_ * local_360._0_8_;
    auVar39 = vfnmsub231sd_avx512f(auVar96,auVar31,auVar26);
    local_78 = auVar27._0_8_;
    auVar27 = vfnmadd231sd_avx512f(auVar39,auVar31,auVar25);
    auVar27 = vfmadd231sd_fma(auVar27,auVar23,auVar35);
    auVar27 = vfmadd231sd_avx512f(auVar27,auVar28,auVar35);
    auVar27 = vfmadd231sd_avx512f(auVar27,auVar32,local_340);
    auVar27 = vfmadd213sd_avx512f(auVar38,local_360,auVar27);
    dVar62 = auVar26._0_8_;
    dVar67 = auVar24._0_8_;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = dVar62 * dVar67;
    auVar27 = vfnmadd213sd_avx512f(auVar97,auVar28,auVar27);
    auVar90._8_8_ = 0;
    auVar90._0_8_ = auVar23._0_8_ * auVar32._0_8_;
    auVar27 = vfmadd213sd_avx512f(auVar90,local_340,auVar27);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_360._0_8_ * local_360._0_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = auVar25._0_8_ * dVar67;
    auVar27 = vfnmadd213sd_fma(auVar98,auVar69,auVar27);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar62 + dVar62;
    auVar27 = vfnmadd231sd_fma(auVar27,auVar91,auVar24);
    auVar23 = vmulsd_avx512f(auVar100,auVar91);
    auVar23 = vmulsd_avx512f(local_340,auVar23);
    local_70 = auVar27._0_8_;
    auVar27 = vfmadd231sd_fma(auVar22,local_360,auVar23);
    auVar22 = vmulsd_avx512f(auVar100,auVar29);
    auVar27 = vfnmadd231sd_fma(auVar27,local_360,auVar34);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = auVar22._0_8_ * auVar25._0_8_;
    auVar27 = vfnmadd213sd_fma(auVar92,local_360,auVar27);
    local_68 = auVar27._0_8_;
    auVar27 = vmulsd_avx512f(auVar102,ZEXT816(0xc000000000000000));
    auVar93._8_8_ = 0;
    auVar93._0_8_ = auVar27._0_8_ * dVar67;
    auVar27 = vmulsd_avx512f(auVar11,auVar93);
    auVar27 = vmulsd_avx512f(auVar105,auVar27);
    auVar27 = vmulsd_avx512f(local_340,auVar27);
    auVar27 = vfmadd213sd_fma(auVar27,local_360,auVar37);
    auVar22 = vmulsd_avx512f(auVar28,auVar24);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = auVar33._0_8_ + auVar33._0_8_;
    auVar27 = vfmadd213sd_avx512f(auVar87,local_340,auVar27);
    auVar27 = vfnmadd231sd_fma(auVar27,auVar26,auVar25);
    auVar27 = vfmadd231sd_avx512f(auVar27,auVar26,auVar31);
    auVar23 = vmulsd_avx512f(auVar24,auVar30);
    auVar23 = vmulsd_avx512f(auVar105,auVar23);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = auVar27._0_8_ - auVar36._0_8_;
    auVar27 = vfnmadd213sd_avx512f(auVar23,local_340,auVar81);
    auVar27 = vfmadd213sd_fma(auVar22,auVar26,auVar27);
    auVar27 = vfmadd231sd_fma(auVar27,auVar37,auVar69);
    local_60 = auVar27._0_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_400,
               (DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_80);
    math::o4_roots((vector<double,_std::allocator<double>_> *)&local_198,(MatrixXd *)local_400);
    Eigen::internal::handmade_aligned_free((void *)local_400._0_8_);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar61;
    lVar21 = 0;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    local_180 = vxorpd_avx512vl(auVar12,auVar7);
    local_310._32_8_ = (local_180._0_8_ * (double)uVar19) / dVar40;
    for (; lVar21 != 4; lVar21 = lVar21 + 1) {
      dVar62 = local_198._M_impl.super__Vector_impl_data._M_start[lVar21];
      dVar61 = 1.0 - dVar62 * dVar62;
      if (dVar61 < 0.0) {
        auVar59._0_8_ = sqrt(dVar61);
        auVar59._8_56_ = extraout_var_01;
        auVar27 = auVar59._0_16_;
      }
      else {
        auVar53._8_8_ = 0;
        auVar53._0_8_ = dVar61;
        auVar27 = vsqrtsd_avx(auVar53,auVar53);
      }
      dVar67 = auVar27._0_8_;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = dVar62;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar20;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_310._32_8_;
      auVar22 = vfnmadd213sd_fma(auVar70,auVar88,auVar2);
      auVar22 = vfmadd231sd_fma(auVar22,local_340,local_360);
      auVar68._0_8_ =
           auVar22._0_8_ /
           ((((double)uVar20 * dVar62 * (double)local_180._0_8_) / dVar40 + (double)uVar19) -
           local_340._0_8_);
      auVar68._8_8_ = auVar22._8_8_;
      auVar54._0_8_ = 1.0 / (auVar68._0_8_ * auVar68._0_8_ + 1.0);
      auVar54._8_8_ = 0;
      local_268._56_16_ = vsqrtsd_avx(auVar54,auVar54);
      dVar61 = 1.0 - local_268._56_8_ * local_268._56_8_;
      if (dVar61 < 0.0) {
        local_350._0_8_ = auVar68._0_8_;
        auVar60._0_8_ = sqrt(dVar61);
        auVar60._8_56_ = extraout_var_02;
        auVar22 = auVar60._0_16_;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = (double)local_350._0_8_;
      }
      else {
        auVar55._8_8_ = 0;
        auVar55._0_8_ = dVar61;
        auVar22 = vsqrtsd_avx(auVar55,auVar55);
      }
      uVar4 = vcmpsd_avx512f(auVar68,ZEXT816(0),1);
      bVar5 = (bool)((byte)uVar4 & 1);
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar23 = vxorpd_avx512vl(auVar22,auVar8);
      local_400._0_8_ = local_2c0;
      local_350._0_8_ = (ulong)bVar5 * auVar23._0_8_ + (ulong)!bVar5 * auVar22._0_8_;
      local_350._8_8_ = auVar22._8_8_;
      auVar22 = vfmadd213sd_fma(local_360,local_268._56_16_,local_350);
      local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = auVar22._0_8_;
      local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)local_340._0_8_ * (double)local_350._0_8_ *
            local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
      local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)local_340._0_8_ * dVar62 * local_268._56_8_ *
            local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
      local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (double)local_340._0_8_ * dVar67 * local_268._56_8_ *
            local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
      local_400._8_8_ = (LhsNested)local_278;
      local_3f0.m_other = (double)&local_1b0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                (&local_1b0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)local_400);
      local_3f0.m_other = (double)(local_150 + 0x18);
      auVar66._0_8_ = -(double)local_350._0_8_;
      auVar66._8_8_ = local_350._8_8_ ^ 0x8000000000000000;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = dVar62 * -(double)local_268._56_8_;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)vmovlpd_avx(auVar66);
      uStack_438 = auVar27._8_8_;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = dVar67 * -(double)local_268._56_8_;
      auVar56._0_8_ = -dVar67;
      auVar56._8_8_ = uStack_438 ^ 0x8000000000000000;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)local_268._56_8_;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = dVar62 * auVar66._0_8_;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = dVar67 * auVar66._0_8_;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = (double)vmovlpd_avx(auVar56);
      local_400._0_8_ = (LhsNested)local_278;
      local_400._8_8_ = &local_218;
      local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = dVar62;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                (&local_218,
                 (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
                  *)local_400);
      local_2c0._24_8_ = local_3b8;
      local_290 = 0.0;
      dStack_288 = 1.48219693752374e-323;
      local_280 = 1.48219693752374e-323;
      local_298 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                   *)local_400;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)(local_2c0 + 0x18),
                 &local_1b0);
      local_290 = 0.0;
      dStack_288 = 0.0;
      local_280 = 1.48219693752374e-323;
      local_2c0._24_8_ =
           (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
            *)local_400;
      local_298 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                   *)local_400;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)(local_2c0 + 0x18),
                 &local_218);
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                   *)local_310._40_8_,(value_type *)local_400);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_198);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_kneip_main(
    const bearingVectors_t & f,
    const points_t & p,
    transformations_t & solutions )
{
  point_t P1 = p[0];
  point_t P2 = p[1];
  point_t P3 = p[2];

  Eigen::Vector3d temp1 = P2 - P1;
  Eigen::Vector3d temp2 = P3 - P1;

  if( temp1.cross(temp2).norm() == 0)
    return;

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  Eigen::Vector3d e1 = f1;
  Eigen::Vector3d e3 = f1.cross(f2);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  f3 = T*f3;

  if( f3(2,0) > 0)
  {
    f1 = f[1];
    f2 = f[0];
    f3 = f[2];

    e1 = f1;
    e3 = f1.cross(f2);
    e3 = e3/e3.norm();
    e2 = e3.cross(e1);

    T.row(0) = e1.transpose();
    T.row(1) = e2.transpose();
    T.row(2) = e3.transpose();

    f3 = T*f3;

    P1 = p[1];
    P2 = p[0];
    P3 = p[2];
  }

  Eigen::Vector3d n1 = P2-P1;
  n1 = n1/n1.norm();
  Eigen::Vector3d n3 = n1.cross(P3-P1);
  n3 = n3/n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  P3 = N*(P3-P1);

  double d_12 = temp1.norm();
  double f_1 = f3(0,0)/f3(2,0);
  double f_2 = f3(1,0)/f3(2,0);
  double p_1 = P3(0,0);
  double p_2 = P3(1,0);

  double cos_beta = f1.dot(f2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double f_1_pw2 = pow(f_1,2);
  double f_2_pw2 = pow(f_2,2);
  double p_1_pw2 = pow(p_1,2);
  double p_1_pw3 = p_1_pw2 * p_1;
  double p_1_pw4 = p_1_pw3 * p_1;
  double p_2_pw2 = pow(p_2,2);
  double p_2_pw3 = p_2_pw2 * p_2;
  double p_2_pw4 = p_2_pw3 * p_2;
  double d_12_pw2 = pow(d_12,2);
  double b_pw2 = pow(b,2);

  Eigen::Matrix<double,5,1> factors;

  factors(0,0) = -f_2_pw2*p_2_pw4
                 -p_2_pw4*f_1_pw2
                 -p_2_pw4;

  factors(1,0) = 2*p_2_pw3*d_12*b
                 +2*f_2_pw2*p_2_pw3*d_12*b
                 -2*f_2*p_2_pw3*f_1*d_12;

  factors(2,0) = -f_2_pw2*p_2_pw2*p_1_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2*b_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw4
                 +p_2_pw4*f_1_pw2
                 +2*p_1*p_2_pw2*d_12
                 +2*f_1*f_2*p_1*p_2_pw2*d_12*b
                 -p_2_pw2*p_1_pw2*f_1_pw2
                 +2*p_1*p_2_pw2*f_2_pw2*d_12
                 -p_2_pw2*d_12_pw2*b_pw2
                 -2*p_1_pw2*p_2_pw2;

  factors(3,0) = 2*p_1_pw2*p_2*d_12*b
                 +2*f_2*p_2_pw3*f_1*d_12
                 -2*f_2_pw2*p_2_pw3*d_12*b
                 -2*p_1*p_2*d_12_pw2*b;

  factors(4,0) = -2*f_2*p_2_pw2*f_1*p_1*d_12*b
                 +f_2_pw2*p_2_pw2*d_12_pw2
                 +2*p_1_pw3*d_12
                 -p_1_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw2*p_1_pw2
                 -p_1_pw4
                 -2*f_2_pw2*p_2_pw2*p_1*d_12
                 +p_2_pw2*f_1_pw2*p_1_pw2
                 +f_2_pw2*p_2_pw2*d_12_pw2*b_pw2;

  std::vector<double> realRoots = math::o4_roots(factors);

  for( int i = 0; i < 4; i++ )
  {
    double cot_alpha =
        (-f_1*p_1/f_2-realRoots[i]*p_2+d_12*b)/
        (-f_1*realRoots[i]*p_2/f_2+p_1-d_12);

    double cos_theta = realRoots[i];
    double sin_theta = sqrt(1-pow(realRoots[i],2));
    double sin_alpha = sqrt(1/(pow(cot_alpha,2)+1));
    double cos_alpha = sqrt(1-pow(sin_alpha,2));

    if (cot_alpha < 0)
      cos_alpha = -cos_alpha;

    translation_t C;
    C(0,0) = d_12*cos_alpha*(sin_alpha*b+cos_alpha);
    C(1,0) = cos_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);
    C(2,0) = sin_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);

    C = P1 + N.transpose()*C;

    rotation_t R;
    R(0,0) = -cos_alpha;
    R(0,1) = -sin_alpha*cos_theta;
    R(0,2) = -sin_alpha*sin_theta;
    R(1,0) = sin_alpha;
    R(1,1) = -cos_alpha*cos_theta;
    R(1,2) = -cos_alpha*sin_theta;
    R(2,0) = 0.0;
    R(2,1) = -sin_theta;
    R(2,2) = cos_theta;

    R = N.transpose()*R.transpose()*T;

    transformation_t solution;
    solution.col(3) = C;
    solution.block<3,3>(0,0) = R;

    solutions.push_back(solution);
  }
}